

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

bool baryonyx::itm::stop_iterating<baryonyx::itm::maximize_tag,long_double>
               (longdouble value,random_engine *rng)

{
  longdouble lVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  
  lVar1 = (longdouble)0;
  if ((value != lVar1) || (NAN(value) || NAN(lVar1))) {
    bVar3 = lVar1 == value;
    bVar2 = lVar1 < value;
  }
  else {
    dVar4 = std::
            generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                      (rng);
    bVar3 = dVar4 == 0.5;
    bVar2 = 0.5 < dVar4;
  }
  return !bVar2 && !bVar3;
}

Assistant:

inline bool
stop_iterating(Float value, random_engine& rng) noexcept
{
    if (value == 0) {
        std::bernoulli_distribution d(0.5);
        return d(rng);
    }

    if constexpr (std::is_same_v<Mode, minimize_tag>)
        return value > 0;
    else
        return value < 0;
}